

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_766::ConstexprLog2_PowersOfTwo_Test::ConstexprLog2_PowersOfTwo_Test
          (ConstexprLog2_PowersOfTwo_Test *this)

{
  ConstexprLog2_PowersOfTwo_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ConstexprLog2_PowersOfTwo_Test_001af800;
  return;
}

Assistant:

TEST(ConstexprLog2, PowersOfTwo) {
	EXPECT_EQ(detail::log2(   2),  1);
	EXPECT_EQ(detail::log2(   4),  2);
	EXPECT_EQ(detail::log2(   8),  3);
	EXPECT_EQ(detail::log2(  16),  4);
	EXPECT_EQ(detail::log2(  32),  5);
	EXPECT_EQ(detail::log2(  64),  6);
	EXPECT_EQ(detail::log2( 128),  7);
	EXPECT_EQ(detail::log2( 256),  8);
	EXPECT_EQ(detail::log2( 512),  9);
	EXPECT_EQ(detail::log2(1024), 10);
}